

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raytraced_renderer.cpp
# Opt level: O0

void __thiscall CGL::RaytracedRenderer::stop(RaytracedRenderer *this)

{
  value_type ptVar1;
  size_type sVar2;
  reference pptVar3;
  long in_RDI;
  int i;
  int local_c;
  
  switch(*(undefined4 *)(in_RDI + 0x38)) {
  case 0:
  case 1:
    break;
  case 2:
    while (sVar2 = std::
                   stack<CGL::SceneObjects::BVHNode_*,_std::deque<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>_>
                   ::size((stack<CGL::SceneObjects::BVHNode_*,_std::deque<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>_>
                           *)0x151bc2), 1 < sVar2) {
      std::
      stack<CGL::SceneObjects::BVHNode_*,_std::deque<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>_>
      ::pop((stack<CGL::SceneObjects::BVHNode_*,_std::deque<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>_>
             *)0x151bd9);
    }
    *(undefined4 *)(in_RDI + 0x38) = 1;
    break;
  case 3:
    *(undefined1 *)(in_RDI + 0x140) = 0;
  case 4:
    for (local_c = 0; (ulong)(long)local_c < *(ulong *)(in_RDI + 0x130); local_c = local_c + 1) {
      std::vector<std::thread_*,_std::allocator<std::thread_*>_>::operator[]
                ((vector<std::thread_*,_std::allocator<std::thread_*>_> *)(in_RDI + 0x148),
                 (long)local_c);
      std::thread::join();
      pptVar3 = std::vector<std::thread_*,_std::allocator<std::thread_*>_>::operator[]
                          ((vector<std::thread_*,_std::allocator<std::thread_*>_> *)(in_RDI + 0x148)
                           ,(long)local_c);
      ptVar1 = *pptVar3;
      if (ptVar1 != (value_type)0x0) {
        std::thread::~thread((thread *)0x151c5d);
        operator_delete(ptVar1);
      }
    }
    *(undefined4 *)(in_RDI + 0x38) = 1;
  }
  return;
}

Assistant:

void RaytracedRenderer::stop() {
  switch (state) {
    case INIT:
    case READY:
      break;
    case VISUALIZE:
      while (selectionHistory.size() > 1) {
        selectionHistory.pop();
      }
      state = READY;
      break;
    case RENDERING:
      continueRaytracing = false;
    case DONE:
      for (int i=0; i<numWorkerThreads; i++) {
            workerThreads[i]->join();
            delete workerThreads[i];
        }
      state = READY;
      break;
  }
}